

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O3

int __thiscall Program::getNextLineNumber(Program *this,int lineNumber)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  undefined1 *puVar3;
  _Base_ptr p_Var4;
  Program *pPVar5;
  _Base_ptr p_Var6;
  
  p_Var4 = (this->list_of_program)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->list_of_program)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  p_Var6 = &p_Var1->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if (lineNumber <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < lineNumber];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
       (p_Var6 = p_Var2, lineNumber < (int)p_Var2[1]._M_color)) {
      p_Var6 = &p_Var1->_M_header;
    }
  }
  puVar3 = (undefined1 *)std::_Rb_tree_increment(p_Var6);
  pPVar5 = (Program *)(puVar3 + 0x20);
  if ((_Rb_tree_header *)puVar3 == p_Var1) {
    pPVar5 = this;
  }
  return pPVar5->end_line;
}

Assistant:

int Program::getNextLineNumber(int lineNumber) {
    auto iter = list_of_program.find(lineNumber);
    iter++;
    if (iter == list_of_program.end()) return end_line;
    return iter->first;
}